

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NVCtrl.c
# Opt level: O3

int XNVCTRLQueryValidTargetAttributeValues
              (Display *dpy,int target_type,int target_id,uint display_mask,uint attribute,
              NVCTRLAttributeValidValuesRec *values)

{
  int iVar1;
  XExtDisplayInfo *info;
  undefined1 *puVar2;
  undefined4 *puVar3;
  _func_int__XDisplay_ptr *p_Var4;
  long lVar5;
  xnvCtrlQueryValidAttributeValuesReply rep;
  int local_58;
  int local_54;
  undefined1 local_50 [8];
  int local_48;
  int local_44;
  int local_40;
  undefined4 local_3c;
  undefined4 local_38;
  uint local_34;
  
  local_58 = target_id;
  local_54 = target_type;
  info = find_display(dpy);
  if (info == (XExtDisplayInfo *)0x0 || values == (NVCTRLAttributeValidValuesRec *)0x0) {
    return 0;
  }
  if (info->codes == (XExtCodes *)0x0) {
    return 0;
  }
  XNVCTRLCheckTargetData(dpy,info,&local_54,&local_58);
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->lock_display)(dpy);
  }
  puVar2 = (undefined1 *)_XGetRequest(dpy,5,0x10);
  *puVar2 = (char)info->codes->major_opcode;
  puVar2[1] = 5;
  *(undefined2 *)(puVar2 + 6) = (undefined2)local_54;
  *(undefined2 *)(puVar2 + 4) = (undefined2)local_58;
  *(uint *)(puVar2 + 8) = display_mask;
  *(uint *)(puVar2 + 0xc) = attribute;
  iVar1 = _XReply(dpy,local_50,0,1);
  if (iVar1 == 0) {
    if (dpy->lock_fns != (_XLockPtrs *)0x0) {
      (*dpy->lock_fns->unlock_display)(dpy);
    }
    p_Var4 = dpy->synchandler;
    iVar1 = 0;
    goto LAB_001048a5;
  }
  values->type = local_44;
  if (local_44 == 5) {
    puVar3 = &local_38;
    lVar5 = 4;
LAB_0010487e:
    *(undefined4 *)((long)&values->type + lVar5) = *puVar3;
  }
  else if (local_44 == 4) {
    puVar3 = &local_3c;
    (values->u).range.min = local_40;
    lVar5 = 8;
    goto LAB_0010487e;
  }
  values->permissions = local_34;
  if (dpy->lock_fns != (_XLockPtrs *)0x0) {
    (*dpy->lock_fns->unlock_display)(dpy);
  }
  p_Var4 = dpy->synchandler;
  iVar1 = local_48;
LAB_001048a5:
  if (p_Var4 != (_func_int__XDisplay_ptr *)0x0) {
    (*p_Var4)(dpy);
  }
  return iVar1;
}

Assistant:

Bool XNVCTRLQueryValidTargetAttributeValues (
    Display *dpy,
    int target_type,
    int target_id,
    unsigned int display_mask,
    unsigned int attribute,                                 
    NVCTRLAttributeValidValuesRec *values
){
    XExtDisplayInfo *info = find_display (dpy);
    xnvCtrlQueryValidAttributeValuesReply rep;
    xnvCtrlQueryValidAttributeValuesReq   *req;
    Bool exists;
    
    if (!values) return False;

    if(!XextHasExtension(info))
        return False;

    XNVCTRLCheckExtension (dpy, info, False);
    XNVCTRLCheckTargetData(dpy, info, &target_type, &target_id);

    LockDisplay (dpy);
    GetReq (nvCtrlQueryValidAttributeValues, req);
    req->reqType = info->codes->major_opcode;
    req->nvReqType = X_nvCtrlQueryValidAttributeValues;
    req->target_type = target_type;
    req->target_id = target_id;
    req->display_mask = display_mask;
    req->attribute = attribute;
    if (!_XReply (dpy, (xReply *) &rep, 0, xTrue)) {
        UnlockDisplay (dpy);
        SyncHandle ();
        return False;
    }
    exists = rep.flags;
    values->type = rep.attr_type;
    if (rep.attr_type == ATTRIBUTE_TYPE_RANGE) {
        values->u.range.min = rep.min;
        values->u.range.max = rep.max;
    }
    if (rep.attr_type == ATTRIBUTE_TYPE_INT_BITS) {
        values->u.bits.ints = rep.bits;
    }
    values->permissions = rep.perms;
    UnlockDisplay (dpy);
    SyncHandle ();
    return exists;
}